

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readtest.c
# Opt level: O1

int main(void)

{
  int __fd;
  ssize_t sVar1;
  __off_t _Var2;
  uint uVar3;
  char buf [128];
  undefined1 auStack_a8 [128];
  
  __fd = open("my_test.random",0);
  if (__fd < 0) {
    perror("open my_test.random error");
    exit(1);
  }
  uVar3 = 0;
  do {
    sVar1 = read(__fd,auStack_a8,0x80);
    if ((int)sVar1 < 0) {
      perror("read");
      exit(2);
    }
    if ((int)sVar1 < 0x80) {
      fprintf(_stderr,"Seek count=%d\n",(ulong)uVar3);
      _Var2 = lseek(__fd,0,0);
      if (_Var2 < 0) {
        perror("lseek");
        exit(3);
      }
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 1000000);
  close(__fd);
  exit(0);
}

Assistant:

int main(){

  char buf[TEST_BUF_SIZE];
  int fd, i, numbytes;

  fd = open(FILE_NAME, O_RDONLY);
  if (fd < 0) {
    perror("open " FILE_NAME " error");
    exit(1);
  }

  /* read 1M till end of file, then seek to start */

  for (i = 0; i < MAX_READS; i++) {
    numbytes = read(fd, buf, TEST_BUF_SIZE);
    if (numbytes < 0) {
      perror("read");
      exit(2);
    }
    if (numbytes < TEST_BUF_SIZE) { /* partial read or EOF, seek to start */
      fprintf(stderr, "Seek count=%d\n", i);
      if (lseek(fd, 0, SEEK_SET) < 0) {
	perror("lseek");
	exit(3);
      }
    }
  }
  close(fd);
  exit(0);
}